

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pack.cpp
# Opt level: O2

int cli::pack(Parser *parse,Option *options)

{
  Descriptor *pDVar1;
  bool bVar2;
  Compression compression;
  ostream *poVar3;
  long lVar4;
  allocator<char> local_a9;
  Option *local_a8;
  string outPath;
  ArchiveBuilder archive;
  string path;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&outPath,"./archive.zap",(allocator<char> *)&archive);
  if (options[4].arg != (char *)0x0) {
    std::__cxx11::string::assign((char *)&outPath);
  }
  pDVar1 = options[6].desc;
  local_a8 = options;
  ZAP::ArchiveBuilder::ArchiveBuilder(&archive);
  for (lVar4 = 0; lVar4 < parse->nonop_count; lVar4 = lVar4 + 1) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&path,parse->nonop_args[lVar4],&local_a9);
    cleanPath(&path);
    bVar2 = isDirectory(&path);
    if (bVar2) {
      anon_unknown_4::addDirectory(&archive,&path,pDVar1 != (Descriptor *)0x0);
    }
    else {
      anon_unknown_4::addPath(&archive,&path);
    }
    std::__cxx11::string::~string((string *)&path);
  }
  if (local_a8[5].arg == (char *)0x0) {
    compression = NONE;
  }
  else {
    compression = atoi(local_a8[5].arg);
  }
  bVar2 = ZAP::ArchiveBuilder::buildFile(&archive,&outPath,compression);
  if (!bVar2) {
    poVar3 = std::operator<<((ostream *)&std::cerr,"Could not build archive");
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  ZAP::ArchiveBuilder::~ArchiveBuilder(&archive);
  std::__cxx11::string::~string((string *)&outPath);
  return (uint)!bVar2;
}

Assistant:

int pack(option::Parser &parse, option::Option *options)
	{
		std::string outPath = "./archive.zap";
		if (options[PACK].arg != nullptr)
			outPath = options[PACK].arg;

		bool recursive = (options[RECURSIVE] != nullptr);

		ZAP::ArchiveBuilder archive;

		for (int i = 0; i < parse.nonOptionsCount(); ++i)
		{
			std::string path = parse.nonOption(i);
			cleanPath(path);

			if (isDirectory(path))
				addDirectory(archive, path, recursive);
			else
				addPath(archive, path);
		}

		ZAP::Compression compression = ZAP::Compression::NONE;
		if (options[COMPRESS].arg != nullptr)
			compression = static_cast<ZAP::Compression>(std::atoi(options[COMPRESS].arg));

		if (!archive.buildFile(outPath, compression))
		{
			std::cerr << "Could not build archive" << std::endl;
			return 1;
		}

		return 0;
	}